

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.c
# Opt level: O0

void free_function(pFunction func)

{
  pFunction func_local;
  
  if (func->type != FT_BUILTIN) {
    if (func->type - FT_USER < 2) {
      free_user_function((func->field_3).user);
    }
    else {
      printf("free_function: unknown function type. Unable to free\n");
    }
  }
  context_unlink(func->context);
  free(func);
  return;
}

Assistant:

void free_function(pFunction func)
{
    switch (func->type)
    {
        case FT_BUILTIN:
            break;
        case FT_USER_MACRO:
        case FT_USER:
            free_user_function(func->user);
            break;
        default:
            log("free_function: unknown function type. Unable to free");
            break;
    }
    context_unlink(func->context);
    free(func);
}